

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abstract_factory.cc
# Opt level: O1

void __thiscall Ellipse::Ellipse(Ellipse *this)

{
  (this->super_Shape).value._M_dataplus._M_p = (pointer)&(this->super_Shape).value.field_2;
  (this->super_Shape).value._M_string_length = 0;
  (this->super_Shape).value.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_replace((ulong)this,0,(char *)0x0,0x1020a9);
  return;
}

Assistant:

Ellipse() {
    value = "ellipse";
  }